

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::load_param(Pooling *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xb,*(int *)(in_RDI + 0xd4));
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,1);
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xc,*(int *)(in_RDI + 0xdc));
  *(int *)(in_RDI + 0xe0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xe4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xe,*(int *)(in_RDI + 0xe4));
  *(int *)(in_RDI + 0xe8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xd,*(int *)(in_RDI + 0xe4));
  *(int *)(in_RDI + 0xec) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0xf,*(int *)(in_RDI + 0xec));
  *(int *)(in_RDI + 0xf0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0xf4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,5,0);
  *(int *)(in_RDI + 0xf8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,6,0);
  *(int *)(in_RDI + 0xfc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,7,0);
  *(int *)(in_RDI + 0x100) = iVar1;
  iVar1 = ParamDict::get(in_RSI,8,0);
  *(int *)(in_RDI + 0x104) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x12,*(int *)(in_RDI + 0x104));
  *(int *)(in_RDI + 0x108) = iVar1;
  return 0;
}

Assistant:

int Pooling::load_param(const ParamDict& pd)
{
    pooling_type = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    stride_w = pd.get(2, 1);
    stride_h = pd.get(12, stride_w);
    pad_left = pd.get(3, 0);
    pad_right = pd.get(14, pad_left);
    pad_top = pd.get(13, pad_left);
    pad_bottom = pd.get(15, pad_top);
    global_pooling = pd.get(4, 0);
    pad_mode = pd.get(5, 0);
    avgpool_count_include_pad = pd.get(6, 0);
    adaptive_pooling = pd.get(7, 0);
    out_w = pd.get(8, 0);
    out_h = pd.get(18, out_w);

    return 0;
}